

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::ScratchAllocator::allocate_raw(ScratchAllocator *this,size_t size,size_t alignment)

{
  ulong uVar1;
  pointer puVar2;
  pointer pBVar3;
  ulong uVar4;
  Impl *this_00;
  ulong local_20;
  
  this_00 = this->impl;
  pBVar3 = (this_00->blocks).
           super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this_00->blocks).
      super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
      ._M_impl.super__Vector_impl_data._M_start == pBVar3) {
    local_20 = 0x10000;
    if (0x10000 < alignment + size) {
      local_20 = alignment + size;
    }
    std::
    vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>
    ::emplace_back<unsigned_long&>
              ((vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>
                *)this_00,&local_20);
    this_00 = this->impl;
    pBVar3 = (this_00->blocks).
             super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  puVar2 = pBVar3[-1].blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar4 = -alignment & (alignment + pBVar3[-1].offset) - 1;
  uVar1 = uVar4 + size;
  if ((ulong)((long)pBVar3[-1].blob.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) < uVar1) {
    local_20 = 0x10000;
    if (0x10000 < alignment + size) {
      local_20 = alignment + size;
    }
    std::
    vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>
    ::emplace_back<unsigned_long&>
              ((vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>
                *)this_00,&local_20);
    puVar2 = (pointer)allocate_raw(this,size,alignment);
  }
  else {
    puVar2 = puVar2 + uVar4;
    pBVar3[-1].offset = uVar1;
  }
  return puVar2;
}

Assistant:

void *ScratchAllocator::allocate_raw(size_t size, size_t alignment)
{
	if (impl->blocks.empty())
		impl->add_block(size + alignment);

	auto &block = impl->blocks.back();

	size_t offset = (block.offset + alignment - 1) & ~(alignment - 1);
	size_t required_size = offset + size;
	if (required_size <= block.blob.size())
	{
		void *ret = block.blob.data() + offset;
		block.offset = required_size;
		return ret;
	}

	impl->add_block(size + alignment);
	return allocate_raw(size, alignment);
}